

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crnlib.cpp
# Opt level: O1

crn_block_compressor_context_t crn_create_block_compressor(crn_comp_params *params)

{
  element *p;
  int iVar1;
  crn_block_compressor *this;
  
  this = (crn_block_compressor *)crnlib::crnlib_malloc(0x12f8);
  crnlib::crn_block_compressor::crn_block_compressor(this);
  iVar1 = crnlib::crn_block_compressor::init(this,(EVP_PKEY_CTX *)params);
  if ((char)iVar1 == '\0') {
    crnlib::etc1_optimizer::~etc1_optimizer
              (&(this->m_set_block_pixels_context).m_etc1_optimizer.m_optimizer);
    crnlib::dxt5_endpoint_optimizer::~dxt5_endpoint_optimizer
              (&(this->m_set_block_pixels_context).m_dxt5_optimizer);
    crnlib::dxt1_endpoint_optimizer::~dxt1_endpoint_optimizer
              (&(this->m_set_block_pixels_context).m_dxt1_optimizer);
    p = (this->m_image).m_elements.m_p;
    if (p != (element *)0x0) {
      crnlib::crnlib_free(p);
    }
    crnlib::crnlib_free(this);
    this = (crn_block_compressor *)0x0;
  }
  return this;
}

Assistant:

crn_block_compressor_context_t crn_create_block_compressor(const crn_comp_params& params) {
  crn_block_compressor* pComp = crnlib_new<crn_block_compressor>();
  if (!pComp->init(params)) {
    crnlib_delete(pComp);
    return NULL;
  }
  return pComp;
}